

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_compaction_test.cc
# Opt level: O0

void * compactor_thread(void *voidargs)

{
  __int_type_conflict1 _Var1;
  bool bVar2;
  uint uVar3;
  timespec ts_1;
  char errno_msg [512];
  int ret;
  list cmp_func_list;
  timespec ts;
  openfiles_elem_conflict query;
  openfiles_elem_conflict *elem;
  avl_node *a;
  fdb_status fs;
  fdb_file_handle *fhandle;
  char new_filename [1024];
  char vfilename [1024];
  fdb_file_handle *in_stack_fffffffffffff038;
  list *in_stack_fffffffffffff040;
  __atomic_base<unsigned_char> *this;
  timespec in_stack_fffffffffffff048;
  fdb_config *in_stack_fffffffffffff058;
  undefined4 in_stack_fffffffffffff060;
  uint in_stack_fffffffffffff064;
  avl_node *in_stack_fffffffffffff068;
  avl_tree *in_stack_fffffffffffff070;
  openfiles_elem_conflict *in_stack_fffffffffffff0a8;
  fdb_encryption_key *in_stack_fffffffffffff130;
  undefined1 in_stack_fffffffffffff13f;
  bid_t in_stack_fffffffffffff140;
  undefined1 in_stack_fffffffffffff14f;
  char *in_stack_fffffffffffff150;
  fdb_file_handle *in_stack_fffffffffffff158;
  fdb_compact_opt *in_stack_fffffffffffff180;
  list local_d98;
  timespec local_d88;
  char local_d78 [1344];
  openfiles_elem_conflict *local_838;
  avl_node *local_830;
  fdb_status local_824;
  char local_818 [1024];
  undefined1 local_418 [1048];
  
  pthread_mutex_lock((pthread_mutex_t *)&sync_mutex);
  _Var1 = std::__atomic_base::operator_cast_to_unsigned_char
                    ((__atomic_base<unsigned_char> *)in_stack_fffffffffffff048.tv_sec);
  if (_Var1 == '\0') {
    local_d88 = convert_reltime_to_abstime(in_stack_fffffffffffff064);
    pthread_cond_timedwait
              ((pthread_cond_t *)&sync_cond,(pthread_mutex_t *)&sync_mutex,(timespec *)&local_d88);
    pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
    while( true ) {
      pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
      local_830 = avl_first(&openfiles);
      while (this = (__atomic_base<unsigned_char> *)in_stack_fffffffffffff048.tv_sec,
            local_830 != (avl_node *)0x0) {
        local_838 = (openfiles_elem_conflict *)(local_830 + -0x36);
        if (local_830[-0xc].right == (avl_node *)0x0) {
          local_830 = avl_next(local_830);
          avl_remove(in_stack_fffffffffffff070,in_stack_fffffffffffff068);
          free(local_838);
        }
        else {
          bVar2 = _compactor_is_threshold_satisfied(in_stack_fffffffffffff0a8);
          if (bVar2) {
            local_838->daemon_compact_in_progress = true;
            local_838->compaction_flag = true;
            pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
            _compactor_get_vfilename
                      ((char *)in_stack_fffffffffffff040,(char *)in_stack_fffffffffffff038);
            list_init(&local_d98);
            fdb_cmp_func_list_from_filemgr
                      ((filemgr *)in_stack_fffffffffffff048.tv_nsec,
                       (list *)in_stack_fffffffffffff048.tv_sec);
            local_824 = fdb_open_for_compactor
                                  ((fdb_file_handle **)in_stack_fffffffffffff068,
                                   (char *)CONCAT44(in_stack_fffffffffffff064,
                                                    in_stack_fffffffffffff060),
                                   in_stack_fffffffffffff058,
                                   (list *)in_stack_fffffffffffff048.tv_nsec);
            fdb_free_cmp_func_list(in_stack_fffffffffffff040);
            if (local_824 == FDB_RESULT_SUCCESS) {
              compactor_get_next_filename
                        ((char *)CONCAT44(in_stack_fffffffffffff064,in_stack_fffffffffffff060),
                         (char *)in_stack_fffffffffffff058);
              in_stack_fffffffffffff038 = (fdb_file_handle *)0x0;
              fdb_compact_file(in_stack_fffffffffffff158,in_stack_fffffffffffff150,
                               (bool)in_stack_fffffffffffff14f,in_stack_fffffffffffff140,
                               (bool)in_stack_fffffffffffff13f,in_stack_fffffffffffff130,
                               in_stack_fffffffffffff180);
              fdb_close(in_stack_fffffffffffff038);
              strcpy(local_d78,local_818);
              pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
              local_830 = avl_search_greater((avl_tree *)in_stack_fffffffffffff058,
                                             (avl_node *)in_stack_fffffffffffff048.tv_nsec,
                                             (avl_cmp_func *)in_stack_fffffffffffff048.tv_sec);
            }
            else {
              fprintf(_stderr,
                      "Error status code: %d, Failed to open the file \'%s\' for auto daemon compaction.\n"
                      ,(ulong)(uint)local_824,local_418);
              pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
              local_830 = avl_next(&local_838->avl);
              local_838->daemon_compact_in_progress = false;
              local_838->compaction_flag = false;
            }
          }
          else {
            bVar2 = _compactor_check_file_removal(local_838);
            if (bVar2) {
              local_838->removal_activated = true;
              pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
              uVar3 = (*local_838->file->ops->close)(local_838->file->fd);
              filemgr_remove_all_buffer_blocks((filemgr *)0x11af0d);
              pthread_mutex_lock((pthread_mutex_t *)&cpt_lock);
              if ((local_838->log_callback != (err_log_callback *)0x0) && (uVar3 != 0)) {
                (*local_838->file->ops->get_errno_str)(&stack0xfffffffffffff058,0x200);
                fprintf(_stderr,
                        "Error status code: %d, Error in REMOVE on a database file \'%s\', %s",
                        (ulong)uVar3,local_838->file->filename,&stack0xfffffffffffff058);
              }
              filemgr_free_func((hash_elem *)in_stack_fffffffffffff048.tv_nsec);
              local_830 = avl_next(local_830);
              avl_remove(in_stack_fffffffffffff070,in_stack_fffffffffffff068);
              free(local_838);
            }
            else {
              local_830 = avl_next(local_830);
            }
          }
          _Var1 = std::__atomic_base::operator_cast_to_unsigned_char
                            ((__atomic_base<unsigned_char> *)in_stack_fffffffffffff048.tv_sec);
          if (_Var1 != '\0') {
            pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
            return (void *)0x0;
          }
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)&cpt_lock);
      pthread_mutex_lock((pthread_mutex_t *)&sync_mutex);
      _Var1 = std::__atomic_base::operator_cast_to_unsigned_char(this);
      if (_Var1 != '\0') {
        pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
        return (void *)0x0;
      }
      in_stack_fffffffffffff048 = convert_reltime_to_abstime(in_stack_fffffffffffff064);
      pthread_cond_timedwait
                ((pthread_cond_t *)&sync_cond,(pthread_mutex_t *)&sync_mutex,
                 (timespec *)&stack0xfffffffffffff048);
      _Var1 = std::__atomic_base::operator_cast_to_unsigned_char
                        ((__atomic_base<unsigned_char> *)in_stack_fffffffffffff048.tv_sec);
      if (_Var1 != '\0') break;
      pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)&sync_mutex);
  }
  return (void *)0x0;
}

Assistant:

static void *_compactor_thread(void *voidargs)
{
    TEST_INIT();
    int revnum = 0;
    struct compactor_thread_args *args = (struct compactor_thread_args *)
                                         voidargs;
    usleep(2000);
    while(args->num_files) {
        int num_files = args->num_files;
        for (int i = 0; i < num_files; ++i) {
            char filename[256];
            fdb_status status;
            fdb_file_handle *dbfile;
            uint64_t num_markers;
            fdb_snapshot_info_t *markers;
            sprintf(filename, "%s_%d.%d", TEST_FILENAME, i, revnum);
            status = fdb_open(&dbfile, filename, &args->config);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_get_all_snap_markers(dbfile, &markers, &num_markers);
            if (status == FDB_RESULT_NO_DB_INSTANCE) {
                usleep(1000);
                fdb_close(dbfile);
                continue;
            }
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            sprintf(filename, "%s_%d.%d", TEST_FILENAME, i, revnum+1);
            fdb_compact_upto(dbfile, filename,
                             num_markers > 5 ? markers[5].marker
                                             : markers[num_markers].marker);
            fdb_free_snap_markers(markers, num_markers);
            fdb_close(dbfile);
        }
        revnum++;
    }
    thread_exit(0);
    return NULL;
}